

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sketch_shader.cpp
# Opt level: O3

void draw_line(float *line_dir,float radius,float *dot_dir,float *c)

{
  bool bVar1;
  bool bVar2;
  int i;
  long lVar3;
  float fVar4;
  float p;
  float __x;
  
  __x = 0.0;
  lVar3 = 0;
  fVar4 = -line_dir[1];
  bVar1 = true;
  do {
    bVar2 = bVar1;
    __x = __x + fVar4 * dot_dir[lVar3];
    lVar3 = 1;
    fVar4 = *line_dir;
    bVar1 = false;
  } while (bVar2);
  if (0.0 <= __x) {
    fVar4 = floorf(radius / ((1.0 - *c) * 3.0 * 100.0));
    fVar4 = fmodf(__x,fVar4);
    if (fVar4 < 0.1) {
      lVar3 = 0;
      do {
        c[lVar3] = c[lVar3] * 0.0;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      return;
    }
  }
  if (__x < 0.0) {
    fVar4 = floorf(radius / ((1.0 - *c) * 3.0 * 100.0));
    fVar4 = fmodf(__x,fVar4);
    if (-0.1 < fVar4) {
      lVar3 = 0;
      do {
        c[lVar3] = c[lVar3] * 0.0;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      return;
    }
  }
  c[0] = 1.0;
  c[1] = 1.0;
  c[2] = 1.0;
  return;
}

Assistant:

void draw_line(const vec2 line_dir, const float radius, const vec2 dot_dir, vec3 c){
    vec2 line_perp = {-1*line_dir[1], line_dir[0]};
    float dp = vec2_mul_inner(dot_dir, line_perp);
    if(dp >= 0 && fmod(dp, floor(radius/((1-c[0])*3*100))) < 0.1f){
        vec3_scale(c, c, 0.0f);
    }
    else if(dp < 0 && fmod(dp, floor(radius/((1-c[0])*3*100))) > -0.1f){
        vec3_scale(c, c, 0.0f);
    }
    else {
        c[0] = 1.0f;
        c[1] = 1.0f;
        c[2] = 1.0f;
    }
}